

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O0

err_t cmdSigAppend(char *sig_name,cmd_sig_t *sig)

{
  size_t count;
  blob_t buf;
  char *in_RSI;
  size_t len;
  octet *der;
  err_t code;
  cmd_sig_t *in_stack_00000048;
  octet *in_stack_00000050;
  size_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  count = cmdSigEnc(in_stack_00000050,in_stack_00000048);
  local_4 = 0x1fe;
  if (count != 0xffffffffffffffff) {
    local_4 = 0;
  }
  if (local_4 == 0) {
    buf = blobCreate(in_stack_ffffffffffffffc8);
    local_4 = 0x6e;
    if (buf != (blob_t)0x0) {
      local_4 = 0;
    }
    if (local_4 == 0) {
      cmdSigEnc(in_stack_00000050,in_stack_00000048);
      memRev(buf,count);
      local_4 = cmdFileAppend(in_RSI,(void *)CONCAT44(local_4,in_stack_ffffffffffffffe0),(size_t)buf
                             );
      blobClose((blob_t)0x109afe);
    }
  }
  return local_4;
}

Assistant:

static err_t cmdSigAppend(const char* sig_name, const cmd_sig_t* sig)
{
	err_t code;
	octet* der;
	size_t len;
	// pre
	ASSERT(cmdSigSeemsValid(sig));
	ASSERT(strIsValid(sig_name));
	// определить длину DER-кода
	len = cmdSigEnc(0, sig);
	code = len != SIZE_MAX ? ERR_OK : ERR_BAD_SIG;
	ERR_CALL_CHECK(code);
	// подготовить память
	code = cmdBlobCreate(der, len);
	ERR_CALL_CHECK(code);
	// кодировать
	cmdSigEnc(der, sig);
	memRev(der, len);
	// дописать код к файлу
	code = cmdFileAppend(sig_name, der, len);
	// завершить
	cmdBlobClose(der);
	return code;
}